

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O0

IOTHUB_REGISTRYMANAGER_RESULT
parseDeviceOrModuleListJson
          (BUFFER_HANDLE jsonBuffer,SINGLYLINKEDLIST_HANDLE deviceOrModuleList,
          IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type,int struct_version)

{
  JSON_Status JVar1;
  LOGGER_LOG p_Var2;
  uchar *string;
  JSON_Object *pJVar3;
  IOTHUB_MODULE *moduleInfo_00;
  LIST_ITEM_HANDLE pLVar4;
  LIST_ITEM_HANDLE lastHandle;
  IOTHUB_MODULE *moduleInfo;
  IOTHUB_DEVICE *deviceInfo;
  void *curr_item;
  LIST_ITEM_HANDLE itemHandle;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  IOTHUB_DEVICE_OR_MODULE iothubDeviceOrModule;
  JSON_Object *device_or_module_object;
  size_t i;
  size_t array_count;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  JSON_Array *pJStack_40;
  JSON_Status jsonStatus;
  JSON_Array *device_or_module_array;
  JSON_Value *root_value;
  char *bufferStr;
  IOTHUB_REGISTRYMANAGER_RESULT result;
  int struct_version_local;
  IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type_local;
  SINGLYLINKEDLIST_HANDLE deviceOrModuleList_local;
  BUFFER_HANDLE jsonBuffer_local;
  
  device_or_module_array = (JSON_Array *)0x0;
  pJStack_40 = (JSON_Array *)0x0;
  if (jsonBuffer == (BUFFER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleListJson",0x344,1,"jsonBuffer cannot be NULL");
    }
    bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  }
  else if (deviceOrModuleList == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleListJson",0x349,1,"deviceOrModuleList cannot be NULL");
    }
    bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  }
  else {
    string = BUFFER_u_char(jsonBuffer);
    if (string == (uchar *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"parseDeviceOrModuleListJson",0x350,1,"BUFFER_u_char failed");
      }
      bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else {
      device_or_module_array = (JSON_Array *)json_parse_string((char *)string);
      if (device_or_module_array == (JSON_Array *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"parseDeviceOrModuleListJson",0x355,1,"json_parse_string failed");
        }
        bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
      }
      else {
        pJStack_40 = json_value_get_array((JSON_Value *)device_or_module_array);
        if (pJStack_40 == (JSON_Array *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"parseDeviceOrModuleListJson",0x35a,1,"json_value_get_object failed");
          }
          bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else {
          bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_OK;
          pJVar3 = (JSON_Object *)json_array_get_count(pJStack_40);
          for (device_or_module_object = (JSON_Object *)0x0; device_or_module_object < pJVar3;
              device_or_module_object =
                   (JSON_Object *)((long)&device_or_module_object->wrapping_value + 1)) {
            iothubDeviceOrModule.managedBy = (char *)0x0;
            iothubDeviceOrModule.managedBy =
                 (char *)json_array_get_object(pJStack_40,(size_t)device_or_module_object);
            if ((JSON_Object *)iothubDeviceOrModule.managedBy == (JSON_Object *)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                          ,"parseDeviceOrModuleListJson",0x369,1,"json_array_get_object failed");
              }
              bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
            }
            else {
              initializeDeviceOrModuleInfoMembers((IOTHUB_DEVICE_OR_MODULE *)&l_5);
              bufferStr._4_4_ =
                   parseDeviceOrModuleJsonObject
                             ((JSON_Object *)iothubDeviceOrModule.managedBy,
                              (IOTHUB_DEVICE_OR_MODULE *)&l_5);
              if (bufferStr._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
                if (struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE) {
                  bufferStr._4_4_ =
                       addDeviceOrModuleToLinkedListAsDevice
                                 ((IOTHUB_DEVICE_OR_MODULE *)&l_5,deviceOrModuleList);
                  if (bufferStr._4_4_ == IOTHUB_REGISTRYMANAGER_OK) {
                    free_nonDevice_members_from_deviceOrModule((IOTHUB_DEVICE_OR_MODULE *)&l_5);
                  }
                }
                else {
                  bufferStr._4_4_ =
                       addDeviceOrModuleToLinkedListAsModule
                                 ((IOTHUB_DEVICE_OR_MODULE *)&l_5,deviceOrModuleList,struct_version)
                  ;
                }
                if (bufferStr._4_4_ != IOTHUB_REGISTRYMANAGER_OK) {
                  free_deviceOrModule_members((IOTHUB_DEVICE_OR_MODULE *)&l_5);
                }
              }
              else {
                free_deviceOrModule_members((IOTHUB_DEVICE_OR_MODULE *)&l_5);
              }
            }
            if ((iothubDeviceOrModule.managedBy != (char *)0x0) &&
               (JVar1 = json_object_clear((JSON_Object *)iothubDeviceOrModule.managedBy), JVar1 != 0
               )) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                          ,"parseDeviceOrModuleListJson",0x38e,1,"json_object_clear failed");
              }
              bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
            }
            if (bufferStr._4_4_ != IOTHUB_REGISTRYMANAGER_OK) break;
          }
        }
      }
    }
  }
  if ((pJStack_40 != (JSON_Array *)0x0) && (JVar1 = json_array_clear(pJStack_40), JVar1 != 0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"parseDeviceOrModuleListJson",0x39c,1,"json_array_clear failed");
    }
    bufferStr._4_4_ = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
  }
  if (device_or_module_array != (JSON_Array *)0x0) {
    json_value_free((JSON_Value *)device_or_module_array);
  }
  if ((bufferStr._4_4_ != IOTHUB_REGISTRYMANAGER_OK) &&
     (deviceOrModuleList != (SINGLYLINKEDLIST_HANDLE)0x0)) {
    curr_item = singlylinkedlist_get_head_item(deviceOrModuleList);
    while (curr_item != (void *)0x0) {
      moduleInfo_00 = (IOTHUB_MODULE *)singlylinkedlist_item_get_value((LIST_ITEM_HANDLE)curr_item);
      if (struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE) {
        free_device_members((IOTHUB_DEVICE *)moduleInfo_00);
        free(moduleInfo_00);
      }
      else {
        IoTHubRegistryManager_FreeModuleMembers(moduleInfo_00);
        free(moduleInfo_00);
      }
      pLVar4 = singlylinkedlist_get_next_item((LIST_ITEM_HANDLE)curr_item);
      singlylinkedlist_remove(deviceOrModuleList,(LIST_ITEM_HANDLE)curr_item);
      curr_item = pLVar4;
    }
  }
  return bufferStr._4_4_;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT parseDeviceOrModuleListJson(BUFFER_HANDLE jsonBuffer, SINGLYLINKEDLIST_HANDLE deviceOrModuleList, IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type, int struct_version)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    const char* bufferStr = NULL;
    JSON_Value* root_value = NULL;
    JSON_Array* device_or_module_array = NULL;
    JSON_Status jsonStatus = JSONFailure;

    if (jsonBuffer == NULL)
    {
        LogError("jsonBuffer cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else if (deviceOrModuleList == NULL)
    {
        LogError("deviceOrModuleList cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
    }
    else
    {
        if ((bufferStr = (const char*)BUFFER_u_char(jsonBuffer)) == NULL)
        {
            LogError("BUFFER_u_char failed");
            result = IOTHUB_REGISTRYMANAGER_ERROR;
        }
        else if ((root_value = json_parse_string(bufferStr)) == NULL)
        {
            LogError("json_parse_string failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else if ((device_or_module_array = json_value_get_array(root_value)) == NULL)
        {
            LogError("json_value_get_object failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
        else
        {
            result = IOTHUB_REGISTRYMANAGER_OK;

            size_t array_count = json_array_get_count(device_or_module_array);
            for (size_t i = 0; i < array_count; i++)
            {
                JSON_Object* device_or_module_object = NULL;
                IOTHUB_DEVICE_OR_MODULE iothubDeviceOrModule;

                if ((device_or_module_object = json_array_get_object(device_or_module_array, i)) == NULL)
                {
                    LogError("json_array_get_object failed");
                    result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
                else
                {
                    initializeDeviceOrModuleInfoMembers(&iothubDeviceOrModule);

                    result = parseDeviceOrModuleJsonObject(device_or_module_object, &iothubDeviceOrModule);
                    if (IOTHUB_REGISTRYMANAGER_OK != result)
                    {
                        free_deviceOrModule_members(&iothubDeviceOrModule);
                    }
                    else
                    {
                        if (struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE)
                        {
                            result = addDeviceOrModuleToLinkedListAsDevice(&iothubDeviceOrModule, deviceOrModuleList);
                            if (result == IOTHUB_REGISTRYMANAGER_OK) //only free these if we pass, if we fail, will deal with below
                            {
                                free_nonDevice_members_from_deviceOrModule(&iothubDeviceOrModule);
                            }
                        }
                        else //IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE
                        {
                            result = addDeviceOrModuleToLinkedListAsModule(&iothubDeviceOrModule, deviceOrModuleList, struct_version);
                            //no nonModule members to free... yet
                        }

                        if (result != IOTHUB_REGISTRYMANAGER_OK)
                        {
                            free_deviceOrModule_members(&iothubDeviceOrModule);
                        }
                    }
                }

                if ((device_or_module_object != NULL) && ((jsonStatus = json_object_clear(device_or_module_object)) != JSONSuccess))
                {
                    LogError("json_object_clear failed");
                    result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                }
                if (result != IOTHUB_REGISTRYMANAGER_OK)
                {
                    break;
                }
            }
        }
    }
    if (device_or_module_array != NULL)
    {
        if ((jsonStatus = json_array_clear(device_or_module_array)) != JSONSuccess)
        {
            LogError("json_array_clear failed");
            result = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        }
    }

    if (root_value != NULL)
    {
        json_value_free(root_value);
    }

    if (result != IOTHUB_REGISTRYMANAGER_OK)
    {
        if (deviceOrModuleList != NULL)
        {
            LIST_ITEM_HANDLE itemHandle = singlylinkedlist_get_head_item(deviceOrModuleList);
            while (itemHandle != NULL)
            {
                const void* curr_item = singlylinkedlist_item_get_value(itemHandle);
                if (struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE)
                {
                    IOTHUB_DEVICE* deviceInfo = (IOTHUB_DEVICE*)curr_item;
                    free_device_members(deviceInfo);
                    free(deviceInfo);
                }
                else //IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE
                {
                    IOTHUB_MODULE* moduleInfo = (IOTHUB_MODULE*)curr_item;
                    IoTHubRegistryManager_FreeModuleMembers(moduleInfo);
                    free(moduleInfo);
                }

                LIST_ITEM_HANDLE lastHandle = itemHandle;
                itemHandle = singlylinkedlist_get_next_item(itemHandle);
                singlylinkedlist_remove(deviceOrModuleList, lastHandle);
            }
        }
    }
    return result;
}